

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QFileAction.cpp
# Opt level: O2

void QFileAction::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == IndexOfMethod) {
    if ((*_a[1] == filePathChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      return;
    }
  }
  else if ((_c == InvokeMetaMethod) && (_id == 0)) {
    filePathChanged((QFileAction *)_o,(QString *)_a[1]);
    return;
  }
  return;
}

Assistant:

void QFileAction::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QFileAction *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->filePathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QFileAction::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileAction::filePathChanged)) {
                *result = 0;
                return;
            }
        }
    }
}